

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::ConvolutionLayerParams::Clear(ConvolutionLayerParams *this)

{
  (this->kernelsize_).current_size_ = 0;
  (this->stride_).current_size_ = 0;
  (this->dilationfactor_).current_size_ = 0;
  (this->outputshape_).current_size_ = 0;
  if (this->weights_ != (WeightParams *)0x0) {
    (*(this->weights_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->weights_ = (WeightParams *)0x0;
  if (this->bias_ != (WeightParams *)0x0) {
    (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->kernelchannels_ = 0;
  this->ngroups_ = 0;
  this->bias_ = (WeightParams *)0x0;
  this->outputchannels_ = 0;
  this->isdeconvolution_ = false;
  this->hasbias_ = false;
  clear_ConvolutionPaddingType(this);
  return;
}

Assistant:

void ConvolutionLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ConvolutionLayerParams)
  kernelsize_.Clear();
  stride_.Clear();
  dilationfactor_.Clear();
  outputshape_.Clear();
  if (GetArenaNoVirtual() == NULL && weights_ != NULL) {
    delete weights_;
  }
  weights_ = NULL;
  if (GetArenaNoVirtual() == NULL && bias_ != NULL) {
    delete bias_;
  }
  bias_ = NULL;
  ::memset(&outputchannels_, 0, reinterpret_cast<char*>(&hasbias_) -
    reinterpret_cast<char*>(&outputchannels_) + sizeof(hasbias_));
  clear_ConvolutionPaddingType();
}